

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::FileGenerator::GenerateDescriptorInitializationCodeForImmutable
          (FileGenerator *this,Printer *printer)

{
  btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
  bVar1;
  __uniq_ptr_impl<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
  _Var2;
  __uniq_ptr_impl<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
  _Var3;
  DescriptorPool *this_00;
  char *pcVar4;
  ClassNameResolver *this_01;
  GeneratorFactory *pGVar5;
  undefined1 auVar6 [12];
  undefined8 this_02;
  bool bVar7;
  int iVar8;
  Descriptor *type;
  MessageLite *pMVar9;
  reference ppFVar10;
  FileDescriptor *pFVar11;
  LogMessage *this_03;
  size_type dest_i;
  char *extraout_RDX;
  long lVar12;
  char *alloc;
  allocator_type *in_R9;
  byte bVar13;
  uint uVar14;
  Metadata MVar15;
  iterator iVar16;
  iterator iVar17;
  string_view text;
  string_view text_00;
  string_view name;
  string_view data;
  iterator iter;
  string_view filename;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view str;
  string_view str_00;
  int bytecode_estimate;
  int method_num;
  string file_data;
  FieldDescriptorSet extensions;
  DynamicMessageFactory factory;
  SharedCodeGenerator shared_code_generator;
  int local_1c8 [2];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [8];
  _Head_base<0UL,_google::protobuf::compiler::java::ClassNameResolver_*,_false> local_198;
  size_type local_190;
  LogMessage local_188;
  LogMessageFatal local_178;
  DynamicMessageFactory local_168;
  undefined1 local_128 [16];
  anon_union_232_1_493b367e_for_FileDescriptorProto_3 local_118;
  
  local_128._0_8_ = "";
  if ((this->options_).opensource_runtime == false) {
    local_128._0_8_ = "final";
  }
  alloc = local_128;
  text._M_str = 
  "public static com.google.protobuf.Descriptors.FileDescriptor\n    getDescriptor() {\n  return descriptor;\n}\nprivate static $final$ com.google.protobuf.Descriptors.FileDescriptor\n    descriptor;\nstatic {\n"
  ;
  text._M_len = 0xc9;
  io::Printer::Print<char[6],char_const*>(printer,text,(char (*) [6])"final",(char **)alloc);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  if ((this->options_).opensource_runtime == true) {
    SharedCodeGenerator::SharedCodeGenerator
              ((SharedCodeGenerator *)local_128,this->file_,&this->options_);
    SharedCodeGenerator::GenerateDescriptors((SharedCodeGenerator *)local_128,printer);
    SharedCodeGenerator::~SharedCodeGenerator((SharedCodeGenerator *)local_128);
  }
  local_1c8[0] = 0;
  local_1c8[1] = 0;
  if (0 < this->file_->message_type_count_) {
    lVar12 = 0;
    do {
      _Var2._M_t.
      super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
      .super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>.
      _M_head_impl = (this->message_generators_).
                     super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar12]._M_t.
                     super___uniq_ptr_impl<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
                     ._M_t;
      iVar8 = (**(code **)(*(long *)_Var2._M_t.
                                    super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
                                    .
                                    super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>
                                    ._M_head_impl + 0x18))
                        (_Var2._M_t.
                         super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
                         .
                         super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>
                         ._M_head_impl,printer);
      local_1c8[0] = local_1c8[0] + iVar8;
      alloc = "private static void _clinit_autosplit_dinit_$method_num$() {\n";
      java::anon_unknown_0::MaybeRestartJavaMethod
                (printer,local_1c8,local_1c8 + 1,"_clinit_autosplit_dinit_$method_num$();\n",
                 "private static void _clinit_autosplit_dinit_$method_num$() {\n");
      lVar12 = lVar12 + 1;
    } while (lVar12 < this->file_->message_type_count_);
  }
  if (0 < this->file_->extension_count_) {
    lVar12 = 0;
    do {
      _Var3._M_t.
      super__Tuple_impl<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
      .super__Head_base<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_false>.
      _M_head_impl = (this->extension_generators_).
                     super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar12]._M_t.
                     super___uniq_ptr_impl<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
                     ._M_t;
      iVar8 = (**(code **)(*(long *)_Var3._M_t.
                                    super__Tuple_impl<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
                                    .
                                    super__Head_base<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_false>
                                    ._M_head_impl + 0x18))
                        (_Var3._M_t.
                         super__Tuple_impl<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
                         .
                         super__Head_base<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_false>
                         ._M_head_impl,printer);
      local_1c8[0] = local_1c8[0] + iVar8;
      alloc = "private static void _clinit_autosplit_dinit_$method_num$() {\n";
      java::anon_unknown_0::MaybeRestartJavaMethod
                (printer,local_1c8,local_1c8 + 1,"_clinit_autosplit_dinit_$method_num$();\n",
                 "private static void _clinit_autosplit_dinit_$method_num$() {\n");
      lVar12 = lVar12 + 1;
    } while (lVar12 < this->file_->extension_count_);
  }
  text_00._M_str = "descriptor.resolveAllFeaturesImmutable();\n";
  text_00._M_len = 0x2a;
  io::Printer::Print<>(printer,text_00);
  local_1a0 = (undefined1  [8])
              absl::lts_20250127::container_internal::
              btree<absl::lts_20250127::container_internal::set_params<google::protobuf::FieldDescriptor_const*,google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,std::allocator<google::protobuf::FieldDescriptor_const*>,256,false>>
              ::EmptyNode()::empty_node;
  local_198._M_head_impl =
       (ClassNameResolver *)
       absl::lts_20250127::container_internal::
       btree<absl::lts_20250127::container_internal::set_params<google::protobuf::FieldDescriptor_const*,google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,std::allocator<google::protobuf::FieldDescriptor_const*>,256,false>>
       ::EmptyNode()::empty_node;
  local_190 = 0;
  pFVar11 = this->file_;
  StripSourceRetentionOptions((FileDescriptorProto *)local_128,pFVar11,false);
  local_1c0._8_8_ = 0;
  local_1c0[0x10] = '\0';
  local_1c0._0_8_ = (ClassNameResolver *)(local_1c0 + 0x10);
  MessageLite::SerializeToString((MessageLite *)local_128,(string *)local_1c0);
  this_00 = pFVar11->pool_;
  MVar15 = FileDescriptorProto::GetMetadata
                     ((FileDescriptorProto *)_FileDescriptorProto_default_instance_);
  pcVar4 = ((MVar15.descriptor)->all_names_).payload_;
  name._M_len = (ulong)*(ushort *)(pcVar4 + 2);
  name._M_str = pcVar4 + ~name._M_len;
  type = DescriptorPool::FindMessageTypeByName(this_00,name);
  if (type != (Descriptor *)0x0) {
    DynamicMessageFactory::DynamicMessageFactory(&local_168);
    pMVar9 = &DynamicMessageFactory::GetPrototype(&local_168,type)->super_MessageLite;
    pMVar9 = MessageLite::New(pMVar9,(Arena *)0x0);
    if (pMVar9 == (MessageLite *)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                (&local_178,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/file.cc"
                 ,0x7d,"dynamic_file_proto.get() != nullptr");
LAB_002a00ca:
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_178);
    }
    data._M_str = (char *)local_1c0._0_8_;
    data._M_len = local_1c0._8_8_;
    bVar7 = MessageLite::ParseFromString(pMVar9,data);
    if ((!bVar7) &&
       (absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_178,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/file.cc"
                   ,0x7e,"dynamic_file_proto->ParseFromString(file_data)"), !bVar7))
    goto LAB_002a00ca;
    if (local_190 != 0) {
      absl::lts_20250127::container_internal::
      btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
      ::clear_and_delete((btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                          *)local_1a0,(allocator_type *)&local_198);
    }
    local_198._M_head_impl =
         (ClassNameResolver *)
         absl::lts_20250127::container_internal::
         btree<absl::lts_20250127::container_internal::set_params<google::protobuf::FieldDescriptor_const*,google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,std::allocator<google::protobuf::FieldDescriptor_const*>,256,false>>
         ::EmptyNode()::empty_node;
    local_1a0 = (undefined1  [8])
                absl::lts_20250127::container_internal::
                btree<absl::lts_20250127::container_internal::set_params<google::protobuf::FieldDescriptor_const*,google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,std::allocator<google::protobuf::FieldDescriptor_const*>,256,false>>
                ::EmptyNode()::empty_node;
    local_190 = 0;
    bVar7 = java::anon_unknown_0::CollectExtensions
                      ((Message *)pMVar9,(FieldDescriptorSet *)local_1a0);
    if (!bVar7) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_188,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/file.cc"
                 ,0x82,"CollectExtensions(*dynamic_file_proto, extensions)");
      str._M_str = "Found unknown fields in FileDescriptorProto when building ";
      str._M_len = 0x3a;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                (&local_188,str);
      this_03 = absl::lts_20250127::log_internal::LogMessage::operator<<
                          (&local_188,
                           (string *)
                           ((ulong)local_118._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc));
      str_00._M_str =
           ". It\'s likely that those fields are custom options, however, those options cannot be recognized in the builder pool. This normally should not happen. Please report a bug."
      ;
      str_00._M_len = 0xaa;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                (this_03,str_00);
      if (!bVar7) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_188);
      }
    }
    (*pMVar9->_vptr_MessageLite[1])(pMVar9);
    DynamicMessageFactory::~DynamicMessageFactory(&local_168);
  }
  if ((ClassNameResolver *)local_1c0._0_8_ != (ClassNameResolver *)(local_1c0 + 0x10)) {
    operator_delete((void *)local_1c0._0_8_,CONCAT71(local_1c0._17_7_,local_1c0[0x10]) + 1);
  }
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_128);
  if ((this->options_).strip_nonfunctional_codegen != false) {
    iVar16 = absl::lts_20250127::container_internal::
             btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_>
             ::begin((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_>
                      *)local_1a0);
    local_1c0._0_8_ = iVar16.node_;
    local_1c0._8_4_ = iVar16.position_;
    if (((ulong)local_198._M_head_impl & 7) != 0) goto LAB_002a0164;
    local_128._0_8_ = local_198._M_head_impl;
    local_128._8_4_ =
         ZEXT14(*(byte *)((long)&((local_198._M_head_impl)->options_).annotation_list_file.
                                 _M_dataplus._M_p + 2));
    bVar7 = absl::lts_20250127::container_internal::
            btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
            ::operator!=((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
                          *)local_1c0,(iterator *)local_128);
    if (bVar7) {
      do {
        ppFVar10 = absl::lts_20250127::container_internal::
                   btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
                   ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
                                *)local_1c0);
        pcVar4 = ((*ppFVar10)->containing_type_->all_names_).payload_;
        if ((*(short *)(pcVar4 + 2) == 0x1a) &&
           (iVar8 = bcmp(pcVar4 + -0x1b,"google.protobuf.FeatureSet",0x1a),
           this_02 = local_1c0._0_8_, iVar8 == 0)) {
          if ((local_1c0._0_8_ & 7) != 0) goto LAB_002a0164;
          uVar14 = local_1c0._8_4_;
          if (*(btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                *)(local_1c0._0_8_ + 0xb) ==
              (btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
               )0x0) {
            dest_i = (size_type)(int)local_1c0._8_4_;
            local_168.super_MessageFactory._vptr_MessageFactory = (_func_int **)local_1c0._0_8_;
            local_168.pool_._0_4_ = local_1c0._8_4_;
            bVar1 = *(btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                      *)(local_1c0._0_8_ + 0xb);
            if (bVar1 == (btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                          )0x0) {
              absl::lts_20250127::container_internal::
              btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
              ::operator--((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
                            *)&local_168);
              if (((ulong)local_168.super_MessageFactory._vptr_MessageFactory & 7) != 0)
              goto LAB_002a0164;
              if (((btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                    *)((long)local_168.super_MessageFactory._vptr_MessageFactory + 0xb))->field_0x0
                  == '\0') {
                __assert_fail("iter.node_->is_leaf()",
                              "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/btree.h"
                              ,0x98c,
                              "iterator absl::container_internal::btree<absl::container_internal::set_params<const google::protobuf::FieldDescriptor *, google::protobuf::compiler::java::(anonymous namespace)::FieldDescriptorCompare, std::allocator<const google::protobuf::FieldDescriptor *>, 256, false>>::erase(iterator) [Params = absl::container_internal::set_params<const google::protobuf::FieldDescriptor *, google::protobuf::compiler::java::(anonymous namespace)::FieldDescriptorCompare, std::allocator<const google::protobuf::FieldDescriptor *>, 256, false>]"
                             );
              }
              absl::lts_20250127::container_internal::
              btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
              ::transfer((btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                          *)this_02,dest_i,(long)(int)(uint)local_168.pool_,
                         (btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                          *)local_168.super_MessageFactory._vptr_MessageFactory,
                         (allocator_type *)alloc);
            }
            else {
              bVar13 = (char)local_1c0._8_8_ + 1;
              alloc = (char *)local_1c0._0_8_;
              absl::lts_20250127::container_internal::
              btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
              ::transfer_n((btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                            *)local_1c0._0_8_,
                           (ulong)(byte)((char)*(btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                                                 *)(local_1c0._0_8_ + 10) - bVar13),dest_i,
                           (ulong)bVar13,
                           (btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                            *)local_1c0._0_8_,in_R9);
            }
            if (((ulong)local_168.super_MessageFactory._vptr_MessageFactory & 7) != 0)
            goto LAB_002a0164;
            ((btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
              *)((long)local_168.super_MessageFactory._vptr_MessageFactory + 10))->field_0x0 =
                 ((btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
                   *)((long)local_168.super_MessageFactory._vptr_MessageFactory + 10))->field_0x0 +
                 -1;
            local_190 = local_190 - 1;
            iVar17.position_ = (uint)local_168.pool_;
            iVar17.node_ = (btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
                            *)local_168.super_MessageFactory._vptr_MessageFactory;
            iVar17._12_4_ = 0;
            iVar17 = absl::lts_20250127::container_internal::
                     btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                     ::rebalance_after_delete
                               ((btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                                 *)local_1a0,iVar17);
            local_128._0_8_ = iVar17.node_;
            local_128._8_4_ = iVar17.position_;
            if (bVar1 == (btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                          )0x0) {
              absl::lts_20250127::container_internal::
              btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
              ::operator++((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
                            *)local_128);
            }
            auVar6._8_4_ = local_128._8_4_;
            auVar6._0_8_ = local_128._0_8_;
          }
          else {
            while( true ) {
              iVar8 = local_1c0._8_4_ + 1;
              local_1c0._8_4_ = iVar8;
              if ((int)(uint)(byte)*(btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                                     *)(this_02 + 10) <= iVar8) break;
              ppFVar10 = absl::lts_20250127::container_internal::
                         btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
                         ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
                                      *)local_1c0);
              pcVar4 = ((*ppFVar10)->containing_type_->all_names_).payload_;
              if ((*(short *)(pcVar4 + 2) != 0x1a) ||
                 (iVar8 = bcmp(pcVar4 + -0x1b,"google.protobuf.FeatureSet",0x1a), iVar8 != 0)) {
                lVar12 = (long)(int)uVar14;
                uVar14 = uVar14 + 1;
                *(undefined8 *)(this_02 + lVar12 * 8 + 0x10) =
                     *(undefined8 *)(this_02 + (long)(int)local_1c0._8_4_ * 8 + 0x10);
              }
            }
            local_190 = local_190 -
                        (long)(int)((byte)*(btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                                            *)(this_02 + 10) - uVar14);
            *(btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
              *)(this_02 + 10) = SUB41(uVar14,0);
            local_1c0._8_4_ = uVar14;
            iter.position_ = uVar14;
            iter.node_ = (btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
                          *)local_1c0._0_8_;
            iter._12_4_ = 0;
            iVar17 = absl::lts_20250127::container_internal::
                     btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                     ::rebalance_after_delete
                               ((btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                                 *)local_1a0,iter);
            auVar6 = iVar17._0_12_;
          }
          local_1c0._0_8_ = auVar6._0_8_;
          local_1c0._8_4_ = auVar6._8_4_;
        }
        else {
          absl::lts_20250127::container_internal::
          btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
          ::operator++((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
                        *)local_1c0);
        }
        if (((ulong)local_198._M_head_impl & 7) != 0) goto LAB_002a0164;
        local_128._0_8_ = local_198._M_head_impl;
        local_128._8_4_ =
             ZEXT14(*(byte *)((long)&((local_198._M_head_impl)->options_).annotation_list_file.
                                     _M_dataplus._M_p + 2));
        bVar7 = absl::lts_20250127::container_internal::
                btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
                ::operator!=((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
                              *)local_1c0,(iterator *)local_128);
      } while (bVar7);
    }
  }
  pFVar11 = this->file_;
  if (0 < pFVar11->dependency_count_) {
    iVar8 = 0;
    do {
      pFVar11 = FileDescriptor::dependency(pFVar11,iVar8);
      if (((this->options_).strip_nonfunctional_codegen != true) ||
         (filename._M_str = extraout_RDX,
         filename._M_len = (size_t)(pFVar11->name_->_M_dataplus)._M_p,
         bVar7 = IsKnownFeatureProto((compiler *)pFVar11->name_->_M_string_length,filename), !bVar7)
         ) {
        this_01 = this->name_resolver_;
        pFVar11 = FileDescriptor::dependency(this->file_,iVar8);
        ClassNameResolver::GetClassName_abi_cxx11_((string *)local_128,this_01,pFVar11,true);
        text_01._M_str = "$dependency$.getDescriptor();\n";
        text_01._M_len = 0x1e;
        io::Printer::Print<char[11],std::__cxx11::string>
                  (printer,text_01,(char (*) [11])0x6a5a5f,(string *)local_128);
        if ((ClassNameResolver *)local_128._0_8_ != (ClassNameResolver *)(local_128 + 0x10)) {
          operator_delete((void *)local_128._0_8_,local_118._0_8_ + 1);
        }
      }
      iVar8 = iVar8 + 1;
      pFVar11 = this->file_;
    } while (iVar8 < pFVar11->dependency_count_);
  }
  if (local_190 != 0) {
    text_02._M_str =
         "com.google.protobuf.ExtensionRegistry registry =\n    com.google.protobuf.ExtensionRegistry.newInstance();\n"
    ;
    text_02._M_len = 0x6a;
    io::Printer::Print<>(printer,text_02);
    iVar16 = absl::lts_20250127::container_internal::
             btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_>
             ::begin((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_>
                      *)local_1a0);
    local_128._0_8_ = iVar16.node_;
    local_128._8_4_ = iVar16.position_;
    if (((ulong)local_198._M_head_impl & 7) != 0) {
LAB_002a0164:
      __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/layout.h"
                    ,0x1fe,
                    "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::FieldDescriptor *, google::protobuf::compiler::java::(anonymous namespace)::FieldDescriptorCompare, std::allocator<const google::protobuf::FieldDescriptor *>, 256, false>> *, unsigned int, unsigned char, const google::protobuf::FieldDescriptor *, absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::FieldDescriptor *, google::protobuf::compiler::java::(anonymous namespace)::FieldDescriptorCompare, std::allocator<const google::protobuf::FieldDescriptor *>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 30, 31>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::FieldDescriptor *, google::protobuf::compiler::java::(anonymous namespace)::FieldDescriptorCompare, std::allocator<const google::protobuf::FieldDescriptor *>, 256, false>> *, unsigned int, unsigned char, const google::protobuf::FieldDescriptor *, absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::FieldDescriptor *, google::protobuf::compiler::java::(anonymous namespace)::FieldDescriptorCompare, std::allocator<const google::protobuf::FieldDescriptor *>, 256, false>> *>, StaticSizeSeq = std::integer_sequence<unsigned long, 1, 0, 4, 30, 31>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, OffsetSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, N = 2UL, Char = const char]"
                   );
    }
    local_168.super_MessageFactory._vptr_MessageFactory = (_func_int **)local_198._M_head_impl;
    local_168.pool_._0_4_ =
         (uint)*(byte *)((long)&((local_198._M_head_impl)->options_).annotation_list_file.
                                _M_dataplus._M_p + 2);
    bVar7 = absl::lts_20250127::container_internal::
            btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
            ::operator!=((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
                          *)local_128,(iterator *)&local_168);
    if (bVar7) {
      do {
        ppFVar10 = absl::lts_20250127::container_internal::
                   btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
                   ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
                                *)local_128);
        pGVar5 = (this->generator_factory_)._M_t.
                 super___uniq_ptr_impl<google::protobuf::compiler::java::GeneratorFactory,_std::default_delete<google::protobuf::compiler::java::GeneratorFactory>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::java::GeneratorFactory_*,_std::default_delete<google::protobuf::compiler::java::GeneratorFactory>_>
                 .super__Head_base<0UL,_google::protobuf::compiler::java::GeneratorFactory_*,_false>
                 ._M_head_impl;
        (*pGVar5->_vptr_GeneratorFactory[4])(local_1c0,pGVar5,*ppFVar10);
        iVar8 = (**(code **)(*(long *)local_1c0._0_8_ + 0x20))(local_1c0._0_8_,printer);
        local_1c8[0] = local_1c8[0] + iVar8;
        java::anon_unknown_0::MaybeRestartJavaMethod
                  (printer,local_1c8,local_1c8 + 1,
                   "_clinit_autosplit_dinit_$method_num$(registry);\n",
                   "private static void _clinit_autosplit_dinit_$method_num$(\n    com.google.protobuf.ExtensionRegistry registry) {\n"
                  );
        if ((ClassNameResolver *)local_1c0._0_8_ != (ClassNameResolver *)0x0) {
          (**(code **)(*(long *)local_1c0._0_8_ + 8))();
        }
        absl::lts_20250127::container_internal::
        btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
        ::operator++((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
                      *)local_128);
        bVar7 = absl::lts_20250127::container_internal::
                btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
                ::operator!=((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
                              *)local_128,(iterator *)&local_168);
      } while (bVar7);
    }
    text_03._M_str =
         "com.google.protobuf.Descriptors.FileDescriptor\n    .internalUpdateFileDescriptor(descriptor, registry);\n"
    ;
    text_03._M_len = 0x68;
    io::Printer::Print<>(printer,text_03);
  }
  io::Printer::Outdent(printer);
  text_04._M_str = "}\n";
  text_04._M_len = 2;
  io::Printer::Print<>(printer,text_04);
  if (local_190 != 0) {
    absl::lts_20250127::container_internal::
    btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
    ::clear_and_delete((btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                        *)local_1a0,(allocator_type *)&local_198);
  }
  return;
}

Assistant:

void FileGenerator::GenerateDescriptorInitializationCodeForImmutable(
    io::Printer* printer) {
  printer->Print(
      "public static com.google.protobuf.Descriptors.FileDescriptor\n"
      "    getDescriptor() {\n"
      "  return descriptor;\n"
      "}\n"
      "private static $final$ com.google.protobuf.Descriptors.FileDescriptor\n"
      "    descriptor;\n"
      "static {\n",
      // TODO: Mark this as final.
      "final", options_.opensource_runtime ? "" : "final");
  printer->Indent();

  if (options_.opensource_runtime) {
    SharedCodeGenerator shared_code_generator(file_, options_);
    shared_code_generator.GenerateDescriptors(printer);
  } else {
  }

  int bytecode_estimate = 0;
  int method_num = 0;

  for (int i = 0; i < file_->message_type_count(); i++) {
    bytecode_estimate +=
        message_generators_[i]->GenerateStaticVariableInitializers(printer);
    MaybeRestartJavaMethod(
        printer, &bytecode_estimate, &method_num,
        "_clinit_autosplit_dinit_$method_num$();\n",
        "private static void _clinit_autosplit_dinit_$method_num$() {\n");
  }
  for (int i = 0; i < file_->extension_count(); i++) {
    bytecode_estimate +=
        extension_generators_[i]->GenerateNonNestedInitializationCode(printer);
    MaybeRestartJavaMethod(
        printer, &bytecode_estimate, &method_num,
        "_clinit_autosplit_dinit_$method_num$();\n",
        "private static void _clinit_autosplit_dinit_$method_num$() {\n");
  }
  // Feature resolution for Java features uses extension registry
  // which must happen after internalInit() from
  // GenerateNonNestedInitializationCode
  printer->Print("descriptor.resolveAllFeaturesImmutable();\n");

  // Proto compiler builds a DescriptorPool, which holds all the descriptors to
  // generate, when processing the ".proto" files. We call this DescriptorPool
  // the parsed pool (a.k.a. file_->pool()).
  //
  // Note that when users try to extend the (.*)DescriptorProto in their
  // ".proto" files, it does not affect the pre-built FileDescriptorProto class
  // in proto compiler. When we put the descriptor data in the file_proto, those
  // extensions become unknown fields.
  //
  // Now we need to find out all the extension value to the (.*)DescriptorProto
  // in the file_proto message, and prepare an ExtensionRegistry to return.
  //
  // To find those extensions, we need to parse the data into a dynamic message
  // of the FileDescriptor based on the builder-pool, then we can use
  // reflections to find all extension fields
  FieldDescriptorSet extensions;
  CollectExtensions(*file_, &extensions);

  if (options_.strip_nonfunctional_codegen) {
    // Skip feature extensions, which are a visible (but non-functional)
    // deviation between editions and legacy syntax.
    absl::erase_if(extensions, [](const FieldDescriptor* field) {
      return field->containing_type()->full_name() == "google.protobuf.FeatureSet";
    });
  }

  // Force descriptor initialization of all dependencies.
  for (int i = 0; i < file_->dependency_count(); i++) {
    if (ShouldIncludeDependency(file_->dependency(i), true)) {
      std::string dependency =
          name_resolver_->GetImmutableClassName(file_->dependency(i));
      printer->Print("$dependency$.getDescriptor();\n", "dependency",
                     dependency);
    }
  }

  if (!extensions.empty()) {
    // Must construct an ExtensionRegistry containing all existing extensions
    // and use it to parse the descriptor data again to recognize extensions.
    printer->Print(
        "com.google.protobuf.ExtensionRegistry registry =\n"
        "    com.google.protobuf.ExtensionRegistry.newInstance();\n");
    FieldDescriptorSet::iterator it;
    for (const FieldDescriptor* field : extensions) {
      std::unique_ptr<ExtensionGenerator> generator(
          generator_factory_->NewExtensionGenerator(field));
      bytecode_estimate += generator->GenerateRegistrationCode(printer);
      MaybeRestartJavaMethod(
          printer, &bytecode_estimate, &method_num,
          "_clinit_autosplit_dinit_$method_num$(registry);\n",
          "private static void _clinit_autosplit_dinit_$method_num$(\n"
          "    com.google.protobuf.ExtensionRegistry registry) {\n");
    }
    printer->Print(
        "com.google.protobuf.Descriptors.FileDescriptor\n"
        "    .internalUpdateFileDescriptor(descriptor, registry);\n");
  }

  printer->Outdent();
  printer->Print("}\n");
}